

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

int DSA_generate_parameters_ex
              (DSA *dsa,uint bits,uint8_t *seed_in,size_t seed_len,int *out_counter,
              unsigned_long *out_h,BN_GENCB *cb)

{
  char *pcVar1;
  DSA *pDVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  EVP_MD *md_00;
  undefined4 extraout_var;
  BN_CTX *ctx;
  BIGNUM *pBVar8;
  BIGNUM *r;
  BIGNUM *pBVar9;
  BIGNUM *ret;
  BIGNUM *a;
  BIGNUM *r_00;
  BIGNUM *r_01;
  BIGNUM *pBVar10;
  ulong uVar11;
  BIGNUM *b;
  BN_MONT_CTX *m_ctx;
  char cVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  bool bVar16;
  uchar md [32];
  uchar buf [32];
  uchar seed [32];
  uchar buf2 [32];
  undefined8 local_f0;
  byte local_e8 [40];
  long local_c0;
  BIGNUM *local_b8;
  DSA *local_b0;
  ulong local_a8;
  ulong local_a0;
  char local_98 [32];
  uchar local_78 [32];
  uchar local_58 [40];
  ulong count;
  
  if (10000 < bits) {
    ERR_put_error(10,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0xaa);
    return 0;
  }
  local_b0 = dsa;
  if (bits < 0x800) {
    md_00 = EVP_sha1();
  }
  else {
    md_00 = EVP_sha256();
  }
  iVar3 = EVP_MD_size(md_00);
  count = CONCAT44(extraout_var,iVar3);
  uVar14 = 0x200;
  if (0x200 < bits) {
    uVar14 = bits;
  }
  if (seed_in != (uint8_t *)0x0) {
    if (seed_len < count) {
      return 0;
    }
    if (count != 0) {
      memcpy(local_78,seed_in,count);
    }
  }
  ctx = (BN_CTX *)BN_CTX_new();
  if (ctx == (BN_CTX *)0x0) {
    iVar13 = 0;
    goto LAB_0031b64e;
  }
  BN_CTX_start((BN_CTX *)ctx);
  pBVar8 = BN_CTX_get((BN_CTX *)ctx);
  r = BN_CTX_get((BN_CTX *)ctx);
  pBVar9 = BN_CTX_get((BN_CTX *)ctx);
  ret = BN_CTX_get((BN_CTX *)ctx);
  a = BN_CTX_get((BN_CTX *)ctx);
  local_b8 = BN_CTX_get((BN_CTX *)ctx);
  r_00 = BN_CTX_get((BN_CTX *)ctx);
  r_01 = BN_CTX_get((BN_CTX *)ctx);
  iVar13 = 0;
  if (r_01 != (BIGNUM *)0x0) {
    pBVar10 = BN_value_one();
    uVar14 = (uVar14 + 0x3f & 0x7fc0) - 1;
    iVar4 = BN_lshift(r_01,pBVar10,uVar14);
    if (iVar4 != 0) {
      local_a0 = count - 1;
      local_a8 = (ulong)uVar14 / 0xa0;
      bVar15 = seed_in == (uint8_t *)0x0;
      local_c0 = count - 2;
      iVar4 = 0;
      local_f0 = out_counter;
      while( true ) {
        iVar13 = BN_GENCB_call((BN_GENCB *)cb,0,iVar4);
        if (iVar13 == 0) break;
        if ((bVar15) && (iVar13 = RAND_bytes(local_78,iVar3), iVar13 == 0)) {
          cVar12 = '\x01';
        }
        else {
          if (count != 0) {
            memcpy(local_98,local_78,count);
          }
          iVar13 = EVP_Digest(local_78,0,local_e8,(uint *)0x0,md_00,(ENGINE *)0x0);
          cVar12 = '\x01';
          if ((iVar13 != 0) &&
             (iVar13 = EVP_Digest(local_98,0,local_58,(uint *)0x0,md_00,(ENGINE *)0x0), iVar13 != 0)
             ) {
            local_e8[0] = local_e8[0] | 0x80;
            local_f0._7_1_ = local_f0._7_1_ | 1;
            pBVar10 = BN_bin2bn(local_e8,iVar3,ret);
            if (pBVar10 != (BIGNUM *)0x0) {
              iVar13 = BN_is_prime_fasttest_ex(ret,0x32,(BN_CTX *)ctx,(uint)bVar15,(BN_GENCB *)cb);
              cVar12 = '\x04';
              if (iVar13 < 1) {
                cVar12 = iVar13 != 0;
              }
            }
          }
        }
        iVar4 = iVar4 + 1;
        bVar15 = true;
        if (cVar12 != '\0') {
          if (cVar12 != '\x04') break;
          iVar13 = 0;
          iVar5 = BN_GENCB_call((BN_GENCB *)cb,2,0);
          if (iVar5 == 0) goto LAB_0031b641;
          iVar13 = 0;
          iVar5 = BN_GENCB_call((BN_GENCB *)cb,3,0);
          if (iVar5 == 0) goto LAB_0031b641;
          iVar5 = 0;
          do {
            if (iVar5 != 0) {
              iVar13 = 0;
              iVar6 = BN_GENCB_call((BN_GENCB *)cb,0,iVar5);
              if (iVar6 == 0) goto LAB_0031b641;
            }
            BN_zero((BIGNUM *)pBVar9);
            uVar11 = local_a0;
            iVar6 = 0;
LAB_0031b47f:
            do {
              if (uVar11 < count) {
                pcVar1 = local_98 + uVar11;
                *pcVar1 = *pcVar1 + '\x01';
                uVar11 = uVar11 - 1;
                if (*pcVar1 == '\0') goto LAB_0031b47f;
              }
              iVar13 = 0;
              iVar7 = EVP_Digest(local_98,count,local_e8,(uint *)0x0,md_00,(ENGINE *)0x0);
              if ((((iVar7 == 0) ||
                   (pBVar10 = BN_bin2bn(local_e8,iVar3,pBVar8), pBVar10 == (BIGNUM *)0x0)) ||
                  (iVar7 = BN_lshift(pBVar8,pBVar8,iVar3 * 8 * iVar6), iVar7 == 0)) ||
                 (iVar7 = BN_add(pBVar9,pBVar9,pBVar8), iVar7 == 0)) goto LAB_0031b641;
              bVar16 = iVar6 != (int)local_a8;
              uVar11 = local_a0;
              iVar6 = iVar6 + 1;
            } while (bVar16);
            iVar6 = BN_mask_bits(pBVar9,uVar14);
            if (((iVar6 == 0) || (pBVar10 = BN_copy(a,pBVar9), pBVar10 == (BIGNUM *)0x0)) ||
               ((iVar6 = BN_add(a,a,r_01), iVar6 == 0 ||
                (iVar6 = BN_lshift1(pBVar8,ret), pBVar10 = local_b8, iVar6 == 0))))
            goto LAB_0031b641;
            iVar13 = 0;
            iVar6 = BN_div((BIGNUM *)0x0,local_b8,a,pBVar8,(BN_CTX *)ctx);
            if (iVar6 == 0) goto LAB_0031b641;
            b = BN_value_one();
            iVar6 = BN_sub(pBVar8,pBVar10,b);
            if ((iVar6 == 0) || (iVar6 = BN_sub(r_00,a,pBVar8), iVar6 == 0)) goto LAB_0031b641;
            iVar6 = BN_cmp(r_00,r_01);
            if (-1 < iVar6) {
              iVar6 = BN_is_prime_fasttest_ex(r_00,0x32,(BN_CTX *)ctx,1,(BN_GENCB *)cb);
              if (0 < iVar6) {
                iVar3 = BN_GENCB_call((BN_GENCB *)cb,2,1);
                if (iVar3 == 0) goto LAB_0031b641;
                pBVar9 = BN_value_one();
                iVar3 = BN_sub(r_01,r_00,pBVar9);
                if (iVar3 == 0) goto LAB_0031b641;
                iVar13 = 0;
                iVar3 = BN_div(pBVar8,(BIGNUM *)0x0,r_01,ret,(BN_CTX *)ctx);
                if (iVar3 == 0) goto LAB_0031b641;
                m_ctx = (BN_MONT_CTX *)BN_MONT_CTX_new_for_modulus((BIGNUM *)r_00,ctx);
                iVar13 = 0;
                iVar3 = 0;
                if (((m_ctx == (BN_MONT_CTX *)0x0) || (iVar4 = BN_set_word(r_01,2), iVar4 == 0)) ||
                   (iVar4 = BN_mod_exp_mont(r,r_01,pBVar8,r_00,(BN_CTX *)ctx,m_ctx), iVar4 == 0))
                goto LAB_0031b83d;
                uVar14 = 2;
                goto LAB_0031b743;
              }
              if (iVar6 != 0) goto LAB_0031b641;
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 != 0x1000);
        }
      }
      iVar13 = 0;
    }
  }
  goto LAB_0031b641;
  while( true ) {
    pBVar9 = BN_value_one();
    iVar4 = BN_add(r_01,r_01,pBVar9);
    if (iVar4 == 0) break;
    uVar14 = uVar14 + 1;
    iVar4 = BN_mod_exp_mont(r,r_01,pBVar8,r_00,(BN_CTX *)ctx,m_ctx);
    if (iVar4 == 0) break;
LAB_0031b743:
    iVar4 = BN_is_one((BIGNUM *)r);
    iVar13 = iVar3;
    if (iVar4 == 0) {
      iVar3 = BN_GENCB_call((BN_GENCB *)cb,3,1);
      pDVar2 = local_b0;
      if (iVar3 != 0) {
        BN_free((BIGNUM *)local_b0->p);
        BN_free((BIGNUM *)pDVar2->q);
        BN_free((BIGNUM *)pDVar2->g);
        pBVar8 = BN_dup(r_00);
        pDVar2->p = (BIGNUM *)pBVar8;
        pBVar8 = BN_dup(ret);
        pDVar2->q = (BIGNUM *)pBVar8;
        pBVar8 = BN_dup(r);
        pDVar2->g = (BIGNUM *)pBVar8;
        if ((pDVar2->p != (BIGNUM *)0x0) && (pBVar8 != (BIGNUM *)0x0 && pDVar2->q != (BIGNUM *)0x0))
        {
          if (local_f0 != (int *)0x0) {
            *local_f0 = iVar5;
          }
          iVar13 = 1;
          if (out_h != (unsigned_long *)0x0) {
            *out_h = (ulong)uVar14;
          }
        }
      }
      break;
    }
  }
LAB_0031b83d:
  if (m_ctx != (BN_MONT_CTX *)0x0) {
    BN_MONT_CTX_free(m_ctx);
  }
LAB_0031b641:
  BN_CTX_end((BN_CTX *)ctx);
LAB_0031b64e:
  if (ctx != (BN_CTX *)0x0) {
    BN_CTX_free((BN_CTX *)ctx);
  }
  return iVar13;
}

Assistant:

int DSA_generate_parameters_ex(DSA *dsa, unsigned bits, const uint8_t *seed_in,
                               size_t seed_len, int *out_counter,
                               unsigned long *out_h, BN_GENCB *cb) {
  if (bits > OPENSSL_DSA_MAX_MODULUS_BITS) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_INVALID_PARAMETERS);
    return 0;
  }

  unsigned char seed[SHA256_DIGEST_LENGTH];
  unsigned char md[SHA256_DIGEST_LENGTH];
  unsigned char buf[SHA256_DIGEST_LENGTH], buf2[SHA256_DIGEST_LENGTH];
  BIGNUM *r0, *W, *X, *c, *test;
  BIGNUM *g = NULL, *q = NULL, *p = NULL;
  int k, n = 0, m = 0;
  int counter = 0;
  int r = 0;
  unsigned int h = 2;
  const EVP_MD *evpmd;

  evpmd = (bits >= 2048) ? EVP_sha256() : EVP_sha1();
  size_t qsize = EVP_MD_size(evpmd);

  if (bits < 512) {
    bits = 512;
  }

  bits = (bits + 63) / 64 * 64;

  if (seed_in != NULL) {
    if (seed_len < qsize) {
      return 0;
    }
    if (seed_len > qsize) {
      // Only consume as much seed as is expected.
      seed_len = qsize;
    }
    OPENSSL_memcpy(seed, seed_in, seed_len);
  }

  bssl::UniquePtr<BN_CTX> ctx(BN_CTX_new());
  if (ctx == nullptr) {
    return 0;
  }
  bssl::BN_CTXScope scope(ctx.get());

  r0 = BN_CTX_get(ctx.get());
  g = BN_CTX_get(ctx.get());
  W = BN_CTX_get(ctx.get());
  q = BN_CTX_get(ctx.get());
  X = BN_CTX_get(ctx.get());
  c = BN_CTX_get(ctx.get());
  p = BN_CTX_get(ctx.get());
  test = BN_CTX_get(ctx.get());

  if (test == NULL || !BN_lshift(test, BN_value_one(), bits - 1)) {
    return 0;
  }

  for (;;) {
    // Find q.
    for (;;) {
      // step 1
      if (!BN_GENCB_call(cb, BN_GENCB_GENERATED, m++)) {
        return 0;
      }

      int use_random_seed = (seed_in == NULL);
      if (use_random_seed) {
        if (!RAND_bytes(seed, qsize)) {
          return 0;
        }
        // DSA parameters are public.
        CONSTTIME_DECLASSIFY(seed, qsize);
      } else {
        // If we come back through, use random seed next time.
        seed_in = NULL;
      }
      OPENSSL_memcpy(buf, seed, qsize);
      OPENSSL_memcpy(buf2, seed, qsize);
      // precompute "SEED + 1" for step 7:
      for (size_t i = qsize - 1; i < qsize; i--) {
        buf[i]++;
        if (buf[i] != 0) {
          break;
        }
      }

      // step 2
      if (!EVP_Digest(seed, qsize, md, NULL, evpmd, NULL) ||
          !EVP_Digest(buf, qsize, buf2, NULL, evpmd, NULL)) {
        return 0;
      }
      for (size_t i = 0; i < qsize; i++) {
        md[i] ^= buf2[i];
      }

      // step 3
      md[0] |= 0x80;
      md[qsize - 1] |= 0x01;
      if (!BN_bin2bn(md, qsize, q)) {
        return 0;
      }

      // step 4
      r = BN_is_prime_fasttest_ex(q, DSS_prime_checks, ctx.get(),
                                  use_random_seed, cb);
      if (r > 0) {
        break;
      }
      if (r != 0) {
        return 0;
      }

      // do a callback call
      // step 5
    }

    if (!BN_GENCB_call(cb, 2, 0) || !BN_GENCB_call(cb, 3, 0)) {
      return 0;
    }

    // step 6
    counter = 0;
    // "offset = 2"

    n = (bits - 1) / 160;

    for (;;) {
      if ((counter != 0) && !BN_GENCB_call(cb, BN_GENCB_GENERATED, counter)) {
        return 0;
      }

      // step 7
      BN_zero(W);
      // now 'buf' contains "SEED + offset - 1"
      for (k = 0; k <= n; k++) {
        // obtain "SEED + offset + k" by incrementing:
        for (size_t i = qsize - 1; i < qsize; i--) {
          buf[i]++;
          if (buf[i] != 0) {
            break;
          }
        }

        if (!EVP_Digest(buf, qsize, md, NULL, evpmd, NULL)) {
          return 0;
        }

        // step 8
        if (!BN_bin2bn(md, qsize, r0) || !BN_lshift(r0, r0, (qsize << 3) * k) ||
            !BN_add(W, W, r0)) {
          return 0;
        }
      }

      // more of step 8
      if (!BN_mask_bits(W, bits - 1) || !BN_copy(X, W) || !BN_add(X, X, test)) {
        return 0;
      }

      // step 9
      if (!BN_lshift1(r0, q) || !BN_mod(c, X, r0, ctx.get()) ||
          !BN_sub(r0, c, BN_value_one()) || !BN_sub(p, X, r0)) {
        return 0;
      }

      // step 10
      if (BN_cmp(p, test) >= 0) {
        // step 11
        r = BN_is_prime_fasttest_ex(p, DSS_prime_checks, ctx.get(), 1, cb);
        if (r > 0) {
          goto end;  // found it
        }
        if (r != 0) {
          return 0;
        }
      }

      // step 13
      counter++;
      // "offset = offset + n + 1"

      // step 14
      if (counter >= 4096) {
        break;
      }
    }
  }
end:
  if (!BN_GENCB_call(cb, 2, 1)) {
    return 0;
  }

  // We now need to generate g
  // Set r0=(p-1)/q
  if (!BN_sub(test, p, BN_value_one()) ||
      !BN_div(r0, NULL, test, q, ctx.get())) {
    return 0;
  }

  bssl::UniquePtr<BN_MONT_CTX> mont(BN_MONT_CTX_new_for_modulus(p, ctx.get()));
  if (mont == nullptr || !BN_set_word(test, h)) {
    return 0;
  }

  for (;;) {
    // g=test^r0%p
    if (!BN_mod_exp_mont(g, test, r0, p, ctx.get(), mont.get())) {
      return 0;
    }
    if (!BN_is_one(g)) {
      break;
    }
    if (!BN_add(test, test, BN_value_one())) {
      return 0;
    }
    h++;
  }

  if (!BN_GENCB_call(cb, 3, 1)) {
    return 0;
  }

  BN_free(dsa->p);
  BN_free(dsa->q);
  BN_free(dsa->g);
  dsa->p = BN_dup(p);
  dsa->q = BN_dup(q);
  dsa->g = BN_dup(g);
  if (dsa->p == NULL || dsa->q == NULL || dsa->g == NULL) {
    return 0;
  }
  if (out_counter != NULL) {
    *out_counter = counter;
  }
  if (out_h != NULL) {
    *out_h = h;
  }

  return 1;
}